

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QBitArray * __thiscall QVariant::toBitArray(QVariant *this)

{
  QBitArray *in_RDI;
  QVariant *in_stack_00000028;
  
  qvariant_cast<QBitArray>(in_stack_00000028);
  return in_RDI;
}

Assistant:

QBitArray QVariant::toBitArray() const
{
    return qvariant_cast<QBitArray>(*this);
}